

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * google::protobuf::compiler::python::
         NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *descriptor,string_view separator)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  Descriptor *descriptor_00;
  AlphaNum *in_R8;
  undefined1 auVar2 [16];
  string_view name_00;
  string_view name_01;
  string_view separator_00;
  string local_2b8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  Descriptor *local_288;
  char *local_280;
  AlphaNum local_278;
  Descriptor *local_248;
  char *pcStack_240;
  AlphaNum local_230;
  AlphaNum local_200;
  undefined4 local_1cc;
  AlphaNum local_1c8;
  AlphaNum local_198;
  AlphaNum local_168;
  AlphaNum local_138;
  AlphaNum local_108;
  undefined1 local_d8 [16];
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  Descriptor *local_b8;
  char *local_b0;
  Descriptor *local_a8;
  char *pcStack_a0;
  undefined1 local_98 [8];
  string prefix;
  Descriptor *parent;
  allocator<char> local_59;
  string_view local_58;
  undefined1 local_48 [8];
  string name;
  EnumDescriptor *descriptor_local;
  string_view separator_local;
  
  separator_00._M_len = separator._M_str;
  descriptor_00 = (Descriptor *)separator._M_len;
  name.field_2._8_8_ = descriptor;
  local_58 = EnumDescriptor::name(descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_48,&local_58,&local_59);
  std::allocator<char>::~allocator(&local_59);
  prefix.field_2._8_8_ = (size_type)EnumDescriptor::containing_type(name.field_2._8_8_);
  if ((Descriptor *)prefix.field_2._8_8_ == (Descriptor *)0x0) {
    local_288 = descriptor_00;
    local_280 = separator_00._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_298,".");
    __x._M_str = local_280;
    __x._M_len = (size_t)local_288;
    __y._M_str = local_298._M_str;
    __y._M_len = local_298._M_len;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      name_01._M_len = auVar2._8_8_;
      name_01._M_str = local_298._M_str;
      ResolveKeyword_abi_cxx11_(&local_2b8,auVar2._0_8_,name_01);
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
    local_1cc = 1;
    goto LAB_0176daf6;
  }
  separator_00._M_str = (char *)in_R8;
  local_a8 = descriptor_00;
  pcStack_a0 = separator_00._M_len;
  NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
            ((string *)local_98,(python *)prefix.field_2._8_8_,descriptor_00,separator_00);
  local_b8 = descriptor_00;
  local_b0 = separator_00._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,".");
  __x_00._M_str = local_b0;
  __x_00._M_len = (size_t)local_b8;
  bVar1 = std::operator==(__x_00,local_c8);
  if (bVar1) {
    local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
    name_00._M_str = local_d8._8_8_;
    name_00._M_len = (size_t)name_00._M_str;
    bVar1 = IsPythonKeyword(local_d8._0_8_,name_00);
    if (!bVar1) goto LAB_0176d9b1;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_108,"getattr(");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_168,", \'");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1c8,"\')");
    absl::lts_20250127::StrCat<>
              (__return_storage_ptr__,&local_108,&local_138,&local_168,&local_198,&local_1c8);
  }
  else {
LAB_0176d9b1:
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_200,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    local_248 = descriptor_00;
    pcStack_240 = separator_00._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_230,separator);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_278,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_200,&local_230,&local_278,in_R8);
  }
  local_1cc = 1;
  std::__cxx11::string::~string((string *)local_98);
LAB_0176daf6:
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        absl::string_view separator) {
  std::string name = std::string(descriptor.name());
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return absl::StrCat("getattr(", prefix, ", '", name, "')");
    } else {
      return absl::StrCat(prefix, separator, name);
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}